

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.h
# Opt level: O2

void __thiscall libDAI::LCLin::LCLin(LCLin *this,LCLin *x)

{
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,&x->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f518;
  {unnamed_type#1}::LCLin((_unnamed_type_1_ *)&this->Props,&x->Props);
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_phis,&x->_phis);
  std::
  vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ::vector(&this->_gamma,&x->_gamma);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_beliefs,&x->_beliefs);
  return;
}

Assistant:

LCLin( const LCLin & x ) : DAIAlgFG(x), Props(x.Props), _maxdiff(x._maxdiff), _iterations(x._iterations), _phis(x._phis), _gamma(x._gamma), _beliefs(x._beliefs) {}